

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O0

event_process_result __thiscall
afsm::transitions::
state_transition_table<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::test::connection_fsm_def::transaction::extended_query,unsigned_long>
::
transit_state<afsm::test::connection_fsm_def::transaction::extended_query::prepare,afsm::test::connection_fsm_def::transaction::extended_query::parse,afsm::none,afsm::actions::detail::guard_check<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::test::connection_fsm_def::transaction::extended_query::prepare,afsm::none,afsm::none>,afsm::actions::detail::action_invocation<afsm::test::transit_action,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::test::connection_fsm_def::transaction::extended_query::prepare,afsm::test:___st::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>>>
          (state_transition_table<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::test::connection_fsm_def::transaction::extended_query,unsigned_long>
           *this,__tuple_element_t<0UL,_tuple<state<prepare,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_state<parse,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_state<bind,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_state<exec,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>_>_>
                 *event)

{
  event_process_result eVar1;
  undefined1 local_36 [6];
  __tuple_element_t<1UL,_tuple<state<prepare,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_state<parse,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_state<bind,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_state<exec,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>_>_>
  *local_30;
  __tuple_element_t<1UL,_tuple<state<prepare,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_state<parse,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_state<bind,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_state<exec,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>_>_>
  *target;
  __tuple_element_t<0UL,_tuple<state<prepare,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_state<parse,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_state<bind,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_state<exec,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>_>_>
  *source;
  none *event_local;
  state_transition_table<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::test::connection_fsm_def::transaction::extended_query,_unsigned_long>
  *this_local;
  
  source = event;
  event_local = (none *)this;
  target = (__tuple_element_t<1UL,_tuple<state<prepare,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_state<parse,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_state<bind,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_state<exec,_inner_state_machine<extended_query,_inner_state_machine<transaction,_state_machine<connection_fsm_def,_mutex,_test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>_>_>
            *)std::
              get<0ul,afsm::state<afsm::test::connection_fsm_def::transaction::extended_query::prepare,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>,afsm::state<afsm::test::connection_fsm_def::transaction::extended_query::parse,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>,afsm::state<afsm::test::connection_fsm_def::transaction::extended_query::bind,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>,afsm::state<afsm::test::connection_fsm_def::transaction::extended_query::exec,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>>
                        ((tuple<afsm::state<afsm::test::connection_fsm_def::transaction::extended_query::prepare,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::extended_query::parse,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::extended_query::bind,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::extended_query::exec,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>_>
                          *)(this + 0x10));
  local_30 = std::
             get<1ul,afsm::state<afsm::test::connection_fsm_def::transaction::extended_query::prepare,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>,afsm::state<afsm::test::connection_fsm_def::transaction::extended_query::parse,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>,afsm::state<afsm::test::connection_fsm_def::transaction::extended_query::bind,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>,afsm::state<afsm::test::connection_fsm_def::transaction::extended_query::exec,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>>
                       ((tuple<afsm::state<afsm::test::connection_fsm_def::transaction::extended_query::prepare,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::extended_query::parse,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::extended_query::bind,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::extended_query::exec,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>_>
                         *)(this + 0x10));
  eVar1 = transit_state_impl<afsm::state<afsm::test::connection_fsm_def::transaction::extended_query::prepare,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>,afsm::state<afsm::test::connection_fsm_def::transaction::extended_query::parse,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>,afsm::none,afsm::actions::detail::guard_check<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,st___st::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>>>
                    (this,source,target,local_30,1,local_36);
  return eVar1;
}

Assistant:

actions::event_process_result
    transit_state(Event&& event, Guard guard, Action action, SourceExit exit,
            TargetEnter enter, SourceClear clear)
    {
        using source_index = ::psst::meta::index_of<SourceState, inner_states_def>;
        using target_index = ::psst::meta::index_of<TargetState, inner_states_def>;

        static_assert(source_index::found, "Failed to find source state index");
        static_assert(target_index::found, "Failed to find target state index");

        auto& source = ::std::get< source_index::value >(states_);
        auto& target = ::std::get< target_index::value >(states_);
        return transit_state_impl(
                ::std::forward<Event>(event), source, target,
                 guard, action, exit, enter, clear,
                 target_index::value,
                 typename def::traits::exception_safety<state_machine_definition_type>::type{});
    }